

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op.c
# Opt level: O1

void tcg_gen_qemu_ld_i64_s390x
               (TCGContext_conflict12 *tcg_ctx,TCGv_i64 val,TCGv_i64 addr,TCGArg idx,
               MemOp_conflict memop)

{
  uint uVar1;
  TCGOp *pTVar2;
  uintptr_t o_1;
  uintptr_t o;
  
  uVar1 = memop << 4 & 0xffffff70;
  if ((memop & MO_64) != MO_8) {
    uVar1 = memop << 4;
  }
  pTVar2 = tcg_emit_op_s390x(tcg_ctx,INDEX_op_qemu_ld_i64);
  pTVar2->args[0] = (TCGArg)(val + (long)tcg_ctx);
  pTVar2->args[1] = (TCGArg)(addr + (long)tcg_ctx);
  pTVar2->args[2] = (ulong)(uVar1 | (uint)idx);
  check_exit_request_s390x(tcg_ctx);
  return;
}

Assistant:

void tcg_gen_qemu_ld_i64(TCGContext *tcg_ctx, TCGv_i64 val, TCGv addr, TCGArg idx, MemOp memop)
{
    MemOp orig_memop;

#if TCG_TARGET_REG_BITS == 32
    if ((memop & MO_SIZE) < MO_64) {
        tcg_gen_qemu_ld_i32(tcg_ctx, TCGV_LOW(tcg_ctx, val), addr, idx, memop);
        if (memop & MO_SIGN) {
            tcg_gen_sari_i32(tcg_ctx, TCGV_HIGH(tcg_ctx, val), TCGV_LOW(tcg_ctx, val), 31);
        } else {
            tcg_gen_movi_i32(tcg_ctx, TCGV_HIGH(tcg_ctx, val), 0);
        }
        check_exit_request(tcg_ctx);
        return;
    }
#endif

    tcg_gen_req_mo(tcg_ctx, TCG_MO_LD_LD | TCG_MO_ST_LD);
    memop = tcg_canonicalize_memop(memop, 1, 0);

    orig_memop = memop;
#if !TCG_TARGET_HAS_MEMORY_BSWAP
    if (memop & MO_BSWAP) {
        memop &= ~MO_BSWAP;
        /* The bswap primitive requires zero-extended input.  */
        if ((memop & MO_SIGN) && (memop & MO_SIZE) < MO_64) {
            memop &= ~MO_SIGN;
        }
    }
#endif

    gen_ldst_i64(tcg_ctx, INDEX_op_qemu_ld_i64, val, addr, memop, idx);

    if ((orig_memop ^ memop) & MO_BSWAP) {
        switch (orig_memop & MO_SIZE) {
        case MO_16:
            tcg_gen_bswap16_i64(tcg_ctx, val, val);
            if (orig_memop & MO_SIGN) {
                tcg_gen_ext16s_i64(tcg_ctx, val, val);
            }
            break;
        case MO_32:
            tcg_gen_bswap32_i64(tcg_ctx, val, val);
            if (orig_memop & MO_SIGN) {
                tcg_gen_ext32s_i64(tcg_ctx, val, val);
            }
            break;
        case MO_64:
            tcg_gen_bswap64_i64(tcg_ctx, val, val);
            break;
        default:
            g_assert_not_reached();
        }
    }
    check_exit_request(tcg_ctx);
}